

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_AM.h
# Opt level: O0

string * __thiscall
BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG>::SoftPrint_abi_cxx11_
          (BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG> *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"BGIP_SolverCreator_AM object with ");
  poVar1 = std::operator<<(poVar1,", _m_verbose=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x10));
  poVar1 = std::operator<<(poVar1,", _m_nrSolutions=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x18));
  poVar1 = std::operator<<(poVar1,", _m_nrRestarts=");
  std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 8));
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string SoftPrint() const
        {
            std::stringstream ss;
            ss << "BGIP_SolverCreator_AM object with "<<
                ", _m_verbose="<<_m_verbose <<
                ", _m_nrSolutions="<<_m_nrSolutions<<
                ", _m_nrRestarts="<<_m_nrRestarts;
            return (ss.str());
        }